

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O1

void testing::internal::
     UniversalPrinter<std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>_>::Print
               (Optional<std::basic_string_view<char>_> *value,ostream *os)

{
  char local_1a [2];
  
  local_1a[1] = 0x28;
  std::__ostream_insert<char,std::char_traits<char>>(os,local_1a + 1,1);
  if ((value->
      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
      _M_engaged == false) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"nullopt",7);
  }
  else {
    UniversalPrinter<std::basic_string_view<char,_std::char_traits<char>_>_>::Print
              ((basic_string_view<char,_std::char_traits<char>_> *)value,os);
  }
  local_1a[0] = ')';
  std::__ostream_insert<char,std::char_traits<char>>(os,local_1a,1);
  return;
}

Assistant:

static void Print(const Optional<T>& value, ::std::ostream* os) {
    *os << '(';
    if (!value) {
      *os << "nullopt";
    } else {
      UniversalPrint(*value, os);
    }
    *os << ')';
  }